

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O1

Config * __thiscall QPDFJob::Config::jobJsonFile(Config *this,string *parameter)

{
  QPDFJob *this_00;
  char *in_RDX;
  string local_110 [7];
  
  this_00 = this->o;
  QUtil::read_file_into_string_abi_cxx11_(local_110,(QUtil *)(parameter->_M_dataplus)._M_p,in_RDX);
  initializeFromJson(this_00,local_110,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110[0]._M_dataplus._M_p != &local_110[0].field_2) {
    operator_delete(local_110[0]._M_dataplus._M_p,local_110[0].field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::jobJsonFile(std::string const& parameter)
{
    try {
        o.initializeFromJson(QUtil::read_file_into_string(parameter.c_str()), true);
    } catch (std::exception& e) {
        throw std::runtime_error(
            "error with job-json file " + std::string(parameter) + ": " + e.what() + "\nRun " +
            this->o.m->message_prefix + " --job-json-help for information on the file format.");
    }
    return this;
}